

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6895b::logical_combination<((anonymous_namespace)::logical_combination_types)2>::
validate(logical_combination<((anonymous_namespace)::logical_combination_types)2> *this,
        json_pointer *ptr,json *instance,json_patch *patch,error_handler *e)

{
  pointer peVar1;
  value_t vVar2;
  array_t *paVar3;
  element_type *peVar4;
  _Alloc_hider _Var5;
  char cVar6;
  pointer psVar7;
  vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *this_00;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined8 *puVar10;
  size_type *psVar11;
  long *plVar12;
  ulong uVar13;
  size_t __new_size;
  ulong uVar14;
  char cVar15;
  undefined8 uVar16;
  pointer peVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  bool bVar19;
  bool bVar20;
  logical_combination_error_handler esub;
  string __str;
  logical_combination_error_handler error_summary;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  pointer *local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  pointer local_a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  error_handler *local_78;
  json_pointer *local_70;
  json *local_68;
  ulong local_60;
  logical_combination<((anonymous_namespace)::logical_combination_types)2> *local_58;
  logical_combination_error_handler local_50;
  
  local_50.super_error_handler._vptr_error_handler =
       (_func_int **)&PTR__logical_combination_error_handler_0015a8c0;
  local_50.error_entry_list_.
  super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.error_entry_list_.
  super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.error_entry_list_.
  super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar7 = (this->subschemata_).
           super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar20 = (this->subschemata_).
           super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
           ._M_impl.super__Vector_impl_data._M_finish == psVar7;
  local_78 = e;
  local_70 = ptr;
  local_68 = instance;
  local_58 = this;
  if (bVar20) {
    bVar19 = true;
  }
  else {
    uVar14 = 0;
    uVar13 = 0;
    do {
      paVar18 = &local_f8.field_2;
      local_d8._M_dataplus._M_p = (pointer)&PTR__logical_combination_error_handler_0015a8c0;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_allocated_capacity = 0;
      local_d8.field_2._8_8_ = 0;
      vVar2 = (patch->j_).m_type;
      __new_size = (size_t)vVar2;
      if (vVar2 != null) {
        if (vVar2 == object) {
          __new_size = (((patch->j_).m_value.object)->_M_t)._M_impl.super__Rb_tree_header.
                       _M_node_count;
        }
        else if (vVar2 == array) {
          paVar3 = (patch->j_).m_value.array;
          __new_size = (long)(paVar3->
                             super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(paVar3->
                             super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 4;
        }
        else {
          __new_size = 1;
        }
      }
      peVar4 = psVar7[uVar13].
               super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_60 = uVar13;
      (*peVar4->_vptr_schema[3])(peVar4,local_70,local_68,patch,&local_d8);
      if (local_d8._M_string_length == local_d8.field_2._M_allocated_capacity) {
        uVar14 = uVar14 + 1;
      }
      else {
        this_00 = nlohmann::json_abi_v3_11_2::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::
                  get_ref_impl<std::vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            (&patch->j_);
        std::
        vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::resize(this_00,__new_size);
        cVar15 = '\x01';
        if (9 < local_60) {
          uVar13 = local_60;
          cVar6 = '\x04';
          do {
            cVar15 = cVar6;
            if (uVar13 < 100) {
              cVar15 = cVar15 + -2;
              goto LAB_00128e38;
            }
            if (uVar13 < 1000) {
              cVar15 = cVar15 + -1;
              goto LAB_00128e38;
            }
            if (uVar13 < 10000) goto LAB_00128e38;
            bVar19 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar6 = cVar15 + '\x04';
          } while (bVar19);
          cVar15 = cVar15 + '\x01';
        }
LAB_00128e38:
        local_b8 = local_a8;
        std::__cxx11::string::_M_construct((ulong)&local_b8,cVar15);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b8,local_b0,local_60);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x1454ad);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_98.field_2._M_allocated_capacity = *psVar11;
          local_98.field_2._8_8_ = plVar8[3];
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar11;
          local_98._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_98._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_98);
        plVar12 = plVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar12) {
          local_f8.field_2._M_allocated_capacity = *plVar12;
          local_f8.field_2._8_8_ = plVar8[3];
          local_f8._M_dataplus._M_p = (pointer)paVar18;
        }
        else {
          local_f8.field_2._M_allocated_capacity = *plVar12;
          local_f8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_f8._M_string_length = plVar8[1];
        *plVar8 = (long)plVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        logical_combination_error_handler::propagate
                  ((logical_combination_error_handler *)&local_d8,&local_50.super_error_handler,
                   &local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar18) {
          operator_delete(local_f8._M_dataplus._M_p,
                          (ulong)(local_f8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (local_b8 != local_a8) {
          operator_delete(local_b8,(ulong)((long)&(local_a8[0]->ptr_).reference_tokens.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1));
        }
      }
      if (1 < uVar14) {
        local_98._M_dataplus._M_p = (pointer)0x56;
        local_f8._M_dataplus._M_p = (pointer)paVar18;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)std::__cxx11::string::_M_create((ulong *)&local_f8,(ulong)&local_98);
        _Var5._M_p = local_98._M_dataplus._M_p;
        local_f8.field_2._M_allocated_capacity = (size_type)local_98._M_dataplus._M_p;
        local_f8._M_dataplus._M_p = (pointer)paVar9;
        memcpy(paVar9,
               "more than one subschema has succeeded, but exactly one of them is required to validate"
               ,0x56);
        local_f8._M_string_length = (size_type)_Var5._M_p;
        paVar9->_M_local_buf[(long)_Var5._M_p] = '\0';
        (*local_78->_vptr_error_handler[2])(local_78,local_70,local_68,&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar18) {
          operator_delete(local_f8._M_dataplus._M_p,
                          (ulong)(local_f8.field_2._M_allocated_capacity + 1));
        }
      }
      uVar16 = local_d8.field_2._M_allocated_capacity;
      local_d8._M_dataplus._M_p = (pointer)&PTR__logical_combination_error_handler_0015a8c0;
      if (local_d8._M_string_length != local_d8.field_2._M_allocated_capacity) {
        plVar8 = (long *)(local_d8._M_string_length + 0x38);
        do {
          if (plVar8 != (long *)plVar8[-2]) {
            operator_delete((long *)plVar8[-2],*plVar8 + 1);
          }
          nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)(plVar8 + -4));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(plVar8 + -7));
          plVar12 = plVar8 + 2;
          plVar8 = plVar8 + 9;
        } while (plVar12 != (long *)uVar16);
      }
      if ((long *)local_d8._M_string_length != (long *)0x0) {
        operator_delete((void *)local_d8._M_string_length,
                        local_d8.field_2._8_8_ - local_d8._M_string_length);
      }
      if (1 < uVar14) break;
      uVar13 = local_60 + 1;
      psVar7 = (local_58->subschemata_).
               super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar19 = uVar13 < (ulong)((long)(local_58->subschemata_).
                                      super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4
                               );
      bVar20 = !bVar19;
    } while (bVar19);
    bVar19 = uVar14 == 0;
  }
  if (!(bool)(bVar20 & bVar19)) goto LAB_001293d0;
  std::operator+(&local_98,
                 "no subschema has succeeded, but one of them is required to validate. Type: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::
                  logical_combination<((anonymous_namespace)::logical_combination_types)2>::
                  key_abi_cxx11_);
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
  paVar18 = &local_d8.field_2;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 == paVar9) {
    local_d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_d8.field_2._8_8_ = puVar10[3];
    local_d8._M_dataplus._M_p = (pointer)paVar18;
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_d8._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_d8._M_string_length = puVar10[1];
  *puVar10 = paVar9;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  uVar13 = (long)(local_58->subschemata_).
                 super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(local_58->subschemata_).
                 super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4;
  cVar15 = '\x01';
  if (9 < uVar13) {
    uVar14 = uVar13;
    cVar6 = '\x04';
    do {
      cVar15 = cVar6;
      if (uVar14 < 100) {
        cVar15 = cVar15 + -2;
        goto LAB_001291be;
      }
      if (uVar14 < 1000) {
        cVar15 = cVar15 + -1;
        goto LAB_001291be;
      }
      if (uVar14 < 10000) goto LAB_001291be;
      bVar20 = 99999 < uVar14;
      uVar14 = uVar14 / 10000;
      cVar6 = cVar15 + '\x04';
    } while (bVar20);
    cVar15 = cVar15 + '\x01';
  }
LAB_001291be:
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct((ulong)&local_b8,cVar15);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b8,local_b0,uVar13);
  peVar1 = (pointer)(local_d8._M_string_length + CONCAT44(uStack_ac,local_b0));
  uVar16 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar18) {
    uVar16 = local_d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < peVar1) {
    peVar17 = (pointer)0xf;
    if (local_b8 != local_a8) {
      peVar17 = local_a8[0];
    }
    if (peVar17 < peVar1) goto LAB_00129223;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_b8,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p);
  }
  else {
LAB_00129223:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8);
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  psVar11 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_f8.field_2._M_allocated_capacity = *psVar11;
    local_f8.field_2._8_8_ = puVar10[3];
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar11;
    local_f8._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_f8._M_string_length = puVar10[1];
  *puVar10 = psVar11;
  puVar10[1] = 0;
  *(undefined1 *)psVar11 = 0;
  (*local_78->_vptr_error_handler[2])(local_78,local_70,local_68,&local_f8);
  paVar9 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar9) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,(ulong)((long)&(local_a8[0]->ptr_).reference_tokens.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar18) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_d8,"[combination: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::
                  logical_combination<((anonymous_namespace)::logical_combination_types)2>::
                  key_abi_cxx11_);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
  plVar12 = plVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar12) {
    local_f8.field_2._M_allocated_capacity = *plVar12;
    local_f8.field_2._8_8_ = plVar8[3];
    local_f8._M_dataplus._M_p = (pointer)paVar9;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *plVar12;
    local_f8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_f8._M_string_length = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  logical_combination_error_handler::propagate(&local_50,local_78,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar9) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar18) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
LAB_001293d0:
  peVar1 = local_50.error_entry_list_.
           super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_50.super_error_handler._vptr_error_handler =
       (_func_int **)&PTR__logical_combination_error_handler_0015a8c0;
  if (local_50.error_entry_list_.
      super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_50.error_entry_list_.
      super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar18 = &((local_50.error_entry_list_.
                 super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start)->message_).field_2;
    do {
      plVar8 = (long *)(((string *)(paVar18 + -1))->_M_dataplus)._M_p;
      if (paVar18 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar8) {
        operator_delete(plVar8,paVar18->_M_allocated_capacity + 1);
      }
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)(paVar18 + -2));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)paVar18 + -0x38));
      peVar17 = (pointer)(paVar18 + 1);
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar18 + 0x48);
    } while (peVar17 != peVar1);
  }
  if (local_50.error_entry_list_.
      super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.error_entry_list_.
                    super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.error_entry_list_.
                          super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.error_entry_list_.
                          super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &patch, error_handler &e) const final
	{
		size_t count = 0;
		logical_combination_error_handler error_summary;

		for (std::size_t index = 0; index < subschemata_.size(); ++index) {
			const std::shared_ptr<schema> &s = subschemata_[index];
			logical_combination_error_handler esub;
			auto oldPatchSize = patch.get_json().size();
			s->validate(ptr, instance, patch, esub);
			if (!esub)
				count++;
			else {
				patch.get_json().get_ref<nlohmann::json::array_t &>().resize(oldPatchSize);
				esub.propagate(error_summary, "case#" + std::to_string(index) + "] ");
			}

			if (is_validate_complete(instance, ptr, e, esub, count, index))
				return;
		}

		if (count == 0) {
			e.error(ptr, instance, "no subschema has succeeded, but one of them is required to validate. Type: " + key + ", number of failed subschemas: " + std::to_string(subschemata_.size()));
			error_summary.propagate(e, "[combination: " + key + " / ");
		}
	}